

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

DaysInYear days_since_jan(long days)

{
  ulong uVar1;
  uint uVar2;
  long d;
  long lVar3;
  uint uVar4;
  long lVar5;
  
  uVar1 = 0x7b2;
  uVar4 = 0x7b1;
  do {
    lVar3 = days;
    uVar2 = uVar4 + 1;
    lVar5 = 0x16d;
    if ((uVar2 & 3) == 0) {
      lVar5 = (ulong)((int)(uVar1 / 400) * -400 + 0x7b2 + uVar4 == 0x7b1 ||
                     (int)(uVar1 / 100) * -100 + 0x7b2 + uVar4 != 0x7b1) + 0x16d;
    }
    uVar1 = (ulong)((int)uVar1 + 1);
    days = lVar3 - lVar5;
    uVar4 = uVar2;
  } while (lVar5 <= lVar3);
  return (DaysInYear)((ulong)uVar2 | lVar3 << 0x20);
}

Assistant:

DaysInYear days_since_jan(long days)
{
	auto year = 1970;
	auto d{ days };
	while (true)
	{
		auto threshold = leapyear(year) ? 366 : 365;
		if (d < threshold)
			break;
		d -= threshold;
		++year;
	}
	return DaysInYear(year, d);
}